

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_IMULH_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  if (instr->src == bVar1) {
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"\tmov rax, ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"\tmul qword ptr [");
    poVar2 = std::operator<<(poVar2,"rsi");
    poVar2 = std::operator<<(poVar2,"+");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,instr->imm32 & 0x1ffff8);
    pcVar3 = "]";
  }
  else {
    genAddressReg(this,instr,"ecx");
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"\tmov rax, ");
    poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&this->field_0x10,"\tmul qword ptr [");
    poVar2 = std::operator<<(poVar2,"rsi");
    pcVar3 = "+rcx]";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&this->field_0x10,"\tmov ");
  poVar2 = std::operator<<(poVar2,*(char **)(regR + (ulong)instr->dst * 8));
  poVar2 = std::operator<<(poVar2,", rdx");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IMULH_M(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			genAddressReg(instr, "ecx");
			asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
			asmCode << "\tmul qword ptr [" << regScratchpadAddr << "+rcx]" << std::endl;
		}
		else {
			asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
			asmCode << "\tmul qword ptr [" << regScratchpadAddr << "+" << genAddressImm(instr) << "]" << std::endl;
		}
		asmCode << "\tmov " << regR[instr.dst] << ", rdx" << std::endl;
		traceint(instr);
	}